

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::STX_ZP_Y(CPU *this)

{
  byte bVar1;
  CPU *this_local;
  
  this->cycles = 4;
  bVar1 = GetByte(this);
  WriteByte(this,(ushort)bVar1 + (ushort)this->Y,this->X);
  this->cycles = this->cycles - 1;
  return;
}

Assistant:

void CPU::STX_ZP_Y()
{
    cycles = 4;
    WriteByte(GetByte() + Y, X);
    cycles--;
}